

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9StripTagsFromString(jx9_context *pCtx,char *zIn,int nByte,char *zTaglist,int nTaglen)

{
  char *pcVar1;
  char *pcVar2;
  sxi32 sVar3;
  char *pcVar4;
  bool bVar5;
  undefined1 local_70 [4];
  sxi32 rc;
  SySet sSet;
  char *zTag;
  char *zPtr;
  char *zEnd;
  int nTaglen_local;
  char *zTaglist_local;
  char *pcStack_18;
  int nByte_local;
  char *zIn_local;
  jx9_context *pCtx_local;
  
  pcVar4 = zIn + nByte;
  SySetInit((SySet *)local_70,&pCtx->pVm->sAllocator,0x10);
  if (0 < nTaglen) {
    AddTag((SySet *)local_70,zTaglist,nTaglen);
  }
  jx9_result_string(pCtx,"",0);
  pcStack_18 = zIn;
  while (pcVar2 = pcStack_18, pcStack_18 < pcVar4) {
    while( true ) {
      bVar5 = false;
      if ((pcStack_18 < pcVar4) && (bVar5 = false, *pcStack_18 != '<')) {
        bVar5 = *pcStack_18 != '\0';
      }
      if (!bVar5) break;
      pcStack_18 = pcStack_18 + 1;
    }
    if (pcVar2 < pcStack_18) {
      jx9_result_string(pCtx,pcVar2,(int)pcStack_18 - (int)pcVar2);
    }
    while( true ) {
      pcVar2 = pcStack_18;
      bVar5 = false;
      if (pcStack_18 < pcVar4) {
        bVar5 = *pcStack_18 == '\0';
      }
      if (!bVar5) break;
      pcStack_18 = pcStack_18 + 1;
    }
    if (pcVar4 <= pcStack_18) break;
    if (*pcStack_18 == '<') {
      sSet.pUserData = pcStack_18;
      do {
        pcVar1 = pcStack_18;
        pcStack_18 = pcVar1 + 1;
        bVar5 = false;
        if (pcStack_18 < pcVar4) {
          bVar5 = *pcStack_18 != '>';
        }
      } while (bVar5);
      if (pcStack_18 < pcVar4) {
        pcStack_18 = pcVar1 + 2;
      }
      sVar3 = FindTag((SySet *)local_70,pcVar2,(int)pcStack_18 - (int)pcVar2);
      if (sVar3 == 0) {
        jx9_result_string(pCtx,(char *)sSet.pUserData,(int)pcStack_18 - (int)sSet.pUserData);
      }
    }
  }
  SySetRelease((SySet *)local_70);
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9StripTagsFromString(jx9_context *pCtx, const char *zIn, int nByte, const char *zTaglist, int nTaglen)
{
	const char *zEnd = &zIn[nByte];
	const char *zPtr, *zTag;
	SySet sSet;
	/* initialize the set of allowed tags */
	SySetInit(&sSet, &pCtx->pVm->sAllocator, sizeof(SyString));
	if( nTaglen > 0 ){
		/* Set of allowed tags */
		AddTag(&sSet, zTaglist, nTaglen);
	}
	/* Set the empty string */
	jx9_result_string(pCtx, "", 0);
	/* Start processing */
	for(;;){
		if(zIn >= zEnd){
			/* No more input to process */
			break;
		}
		zPtr = zIn;
		/* Find a tag */
		while( zIn < zEnd && zIn[0] != '<' && zIn[0] != 0 /* NUL byte */ ){
			zIn++;
		}
		if( zIn > zPtr ){
			/* Consume raw input */
			jx9_result_string(pCtx, zPtr, (int)(zIn-zPtr));
		}
		/* Ignore trailing null bytes */
		while( zIn < zEnd && zIn[0] == 0 ){
			zIn++;
		}
		if(zIn >= zEnd){
			/* No more input to process */
			break;
		}
		if( zIn[0] == '<' ){
			sxi32 rc;
			zTag = zIn++;
			/* Delimit the tag */
			while( zIn < zEnd && zIn[0] != '>' ){
				zIn++;
			}
			if( zIn < zEnd ){
				zIn++; /* Ignore the trailing closing tag */
			}
			/* Query the set */
			rc = FindTag(&sSet, zTag, (int)(zIn-zTag));
			if( rc == SXRET_OK ){
				/* Keep the tag */
				jx9_result_string(pCtx, zTag, (int)(zIn-zTag));
			}
		}
	}
	/* Cleanup */
	SySetRelease(&sSet);
	return SXRET_OK;
}